

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl2.h
# Opt level: O2

void nk_glfw3_clipboard_copy(nk_handle usr,char *text,int len)

{
  char *string;
  nk_size length;
  
  if (len != 0) {
    length = (nk_size)len;
    string = (char *)malloc(length + 1);
    if (string != (char *)0x0) {
      nk_memcopy(string,text,length);
      string[length] = '\0';
      glfwSetClipboardString(glfw.win,string);
      free(string);
      return;
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_glfw3_clipboard_copy(nk_handle usr, const char *text, int len)
{
    char *str = 0;
    (void)usr;
    if (!len) return;
    str = (char*)malloc((size_t)len+1);
    if (!str) return;
    NK_MEMCPY(str, text, (size_t)len);
    str[len] = '\0';
    glfwSetClipboardString(glfw.win, str);
    free(str);
}